

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.c
# Opt level: O0

SPOTTYPE * board_getSpotTypes(Board *board,uchar *spotTypesCountResult)

{
  SPOTTYPE *pSVar1;
  code *pcVar2;
  bool bVar3;
  byte *in_RSI;
  byte *in_RDI;
  Spot *spot;
  SPOTTYPE *spotTypes;
  _Bool hasType;
  uchar spotTypesCount;
  uchar j;
  uchar i;
  SPOTTYPE *local_20;
  byte local_13;
  byte local_12;
  byte local_11;
  
  local_13 = 0;
  local_20 = (SPOTTYPE *)0x0;
  local_11 = 0;
  do {
    if (*in_RDI <= local_11) {
      *in_RSI = local_13;
      return local_20;
    }
    pSVar1 = *(SPOTTYPE **)(*(long *)(in_RDI + 8) + (ulong)local_11 * 8);
    bVar3 = false;
    for (local_12 = 0; local_12 < local_13; local_12 = local_12 + 1) {
      if (local_20[local_12] == *pSVar1) {
        bVar3 = true;
        break;
      }
    }
    if (!bVar3) {
      local_13 = local_13 + 1;
      local_20 = (SPOTTYPE *)realloc(local_20,(ulong)local_13);
      if (SBORROW4((uint)local_13,1)) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      local_20[(int)(local_13 - 1)] = *pSVar1;
    }
    local_11 = local_11 + 1;
  } while( true );
}

Assistant:

SPOTTYPE * board_getSpotTypes(Board * board, unsigned char * spotTypesCountResult)
{
	unsigned char i, j, spotTypesCount=0;
	bool hasType;
	SPOTTYPE * spotTypes = 0;
	Spot * spot;

	for(i=0;i<board->spotsCount;i++)
	{
		spot = board->spots[i];
		hasType = false;
		for(j=0;j<spotTypesCount;j++)
		{
			if(spotTypes[j]==spot->type)
			{
				hasType = true;
				break;
			}
		}

		if(!hasType)
		{
			spotTypesCount++;
			// cppcheck-suppress memleakOnRealloc
			spotTypes = (SPOTTYPE *)realloc(spotTypes, sizeof(SPOTTYPE)*spotTypesCount);
			spotTypes[(spotTypesCount-1)] = spot->type;
		}
	}

	*spotTypesCountResult = spotTypesCount;

	return spotTypes;
}